

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>::decodeArray
          (SIMDSimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t *in,size_t length,
          uint32_t *out,size_t *nvalue)

{
  uint32_t *puVar1;
  NotEnoughStorage *this_00;
  ulong req;
  size_t nvalue_00;
  uint32_t *in_00;
  size_t thisnvalue;
  size_t local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  req = (ulong)*in;
  if (req <= *nvalue) {
    in_00 = in + 1;
    *nvalue = req;
    if (req != 0) {
      puVar1 = out + req;
      local_40 = puVar1;
      local_38 = in;
      do {
        local_48 = length - ((long)in_00 - (long)local_38 >> 2);
        nvalue_00 = (long)puVar1 - (long)out >> 2;
        if (out + this->PageSize < puVar1) {
          nvalue_00 = (ulong)this->PageSize;
        }
        __decodeArray(this,in_00,&local_48,out,nvalue_00);
        out = out + nvalue_00;
        in_00 = in_00 + local_48;
      } while (out != puVar1);
    }
    return in_00;
  }
  this_00 = (NotEnoughStorage *)__cxa_allocate_exception(0x18);
  NotEnoughStorage::NotEnoughStorage(this_00,req);
  __cxa_throw(this_00,&NotEnoughStorage::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              uint32_t *out, size_t &nvalue) override {
    const uint32_t *const initin(in);
    const size_t mynvalue = *in;
    ++in;
    if (mynvalue > nvalue)
      throw NotEnoughStorage(mynvalue);
    nvalue = mynvalue;
    const uint32_t *const finalout(out + nvalue);
    while (out != finalout) {
      size_t thisnvalue = length - (in - initin);
      size_t thissize = static_cast<size_t>(
          finalout > PageSize + out ? PageSize : (finalout - out));

      __decodeArray(in, thisnvalue, out, thissize);
      in += thisnvalue;
      out += thissize;
    }
    assert(initin + length >= in);
    return in;
  }